

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O2

void __thiscall libtorrent::http_parser::~http_parser(http_parser *this)

{
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            (&(this->m_chunked_ranges).
              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->m_header)._M_t);
  std::__cxx11::string::~string((string *)&this->m_server_message);
  std::__cxx11::string::~string((string *)&this->m_protocol);
  std::__cxx11::string::~string((string *)&this->m_path);
  std::__cxx11::string::~string((string *)&this->m_method);
  return;
}

Assistant:

http_parser::~http_parser() = default;